

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall
BitStreamWriter<DataStream>::Write(BitStreamWriter<DataStream> *this,uint64_t data,int nbits)

{
  int iVar1;
  long lVar2;
  out_of_range *this_00;
  int *piVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int bits;
  BitStreamWriter<DataStream> *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int local_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_EDX < 0) || (local_c = in_EDX, 0x40 < in_EDX)) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nbits must be between 0 and 64");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  else {
    while (0 < local_c) {
      piVar3 = std::min<int>(in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffb8);
      iVar1 = *piVar3;
      *(byte *)(in_RDI + 8) =
           *(byte *)(in_RDI + 8) |
           (byte)((ulong)(in_RSI << (0x40U - (char)local_c & 0x3f)) >>
                 ((char)*(undefined4 *)(in_RDI + 0xc) + 0x38U & 0x3f));
      *(int *)(in_RDI + 0xc) = iVar1 + *(int *)(in_RDI + 0xc);
      local_c = local_c - iVar1;
      if (*(int *)(in_RDI + 0xc) == 8) {
        Flush(in_stack_ffffffffffffffb8);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Write(uint64_t data, int nbits) {
        if (nbits < 0 || nbits > 64) {
            throw std::out_of_range("nbits must be between 0 and 64");
        }

        while (nbits > 0) {
            int bits = std::min(8 - m_offset, nbits);
            m_buffer |= (data << (64 - nbits)) >> (64 - 8 + m_offset);
            m_offset += bits;
            nbits -= bits;

            if (m_offset == 8) {
                Flush();
            }
        }
    }